

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_string(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t len;
  
  uVar3 = bson_new();
  cVar1 = bson_append_utf8(uVar3,"foo",0xffffffffffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_utf8 (b, \"foo\", -1, \"bar\", -1)";
    uVar3 = 0x143;
  }
  else {
    pcVar4 = (char *)bson_as_json(uVar3,&len);
    if (len == 0x11) {
      iVar2 = strcmp("{ \"foo\" : \"bar\" }",pcVar4);
      if (iVar2 == 0) {
        bson_free(pcVar4);
        bson_destroy(uVar3);
        return;
      }
      pcVar4 = "!strcmp (\"{ \\\"foo\\\" : \\\"bar\\\" }\", str)";
      uVar3 = 0x146;
    }
    else {
      pcVar4 = "len == 17";
      uVar3 = 0x145;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_as_json_string",pcVar4);
  abort();
}

Assistant:

static void
test_bson_as_json_string (void)
{
   size_t len;
   bson_t *b;
   char *str;

   b = bson_new ();
   BSON_ASSERT (bson_append_utf8 (b, "foo", -1, "bar", -1));
   str = bson_as_json (b, &len);
   BSON_ASSERT (len == 17);
   BSON_ASSERT (!strcmp ("{ \"foo\" : \"bar\" }", str));
   bson_free (str);
   bson_destroy (b);
}